

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

void * Cnf_DataWriteIntoSolver2(Cnf_Dat_t *p,int nFrames,int fInit)

{
  int iVar1;
  int iVar2;
  lit lVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  lit local_6c;
  void *pvStack_68;
  int Lits_1 [1];
  Aig_Obj_t *pObjLo_1;
  int Lits [2];
  int *pLits;
  int nLitsAll;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  int local_30;
  int status;
  int f;
  int i;
  sat_solver2 *pSat;
  int fInit_local;
  int nFrames_local;
  Cnf_Dat_t *p_local;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfMan.c"
                  ,0x1e3,"void *Cnf_DataWriteIntoSolver2(Cnf_Dat_t *, int, int)");
  }
  p_local = (Cnf_Dat_t *)sat_solver2_new();
  sat_solver2_setnvars((sat_solver2 *)p_local,p->nVars * nFrames);
  for (status = 0; status < p->nClauses; status = status + 1) {
    iVar1 = sat_solver2_addclause
                      ((sat_solver2 *)p_local,p->pClauses[status],p->pClauses[status + 1],0);
    if (iVar1 == 0) {
      sat_solver2_delete((sat_solver2 *)p_local);
      return (void *)0x0;
    }
  }
  if (1 < nFrames) {
    iVar1 = p->nVars * 2;
    Lits = *(int (*) [2])p->pClauses;
    for (local_30 = 1; local_30 < nFrames; local_30 = local_30 + 1) {
      for (status = 0; iVar2 = Aig_ManRegNum(p->pMan), status < iVar2; status = status + 1) {
        pAVar4 = Aig_ManLi(p->pMan,status);
        pAVar5 = Aig_ManLo(p->pMan,status);
        lVar3 = toLitCond(p->pVarNums[pAVar4->Id],0);
        pObjLo_1._0_4_ = (local_30 + -1) * iVar1 + lVar3;
        lVar3 = toLitCond(p->pVarNums[pAVar5->Id],1);
        pObjLo_1._4_4_ = local_30 * iVar1 + lVar3;
        iVar2 = sat_solver2_addclause((sat_solver2 *)p_local,(lit *)&pObjLo_1,Lits,0);
        if (iVar2 == 0) {
          sat_solver2_delete((sat_solver2 *)p_local);
          return (void *)0x0;
        }
        pObjLo_1._0_4_ = (int)pObjLo_1 + 1;
        pObjLo_1._4_4_ = pObjLo_1._4_4_ + -1;
        iVar2 = sat_solver2_addclause((sat_solver2 *)p_local,(lit *)&pObjLo_1,Lits,0);
        if (iVar2 == 0) {
          sat_solver2_delete((sat_solver2 *)p_local);
          return (void *)0x0;
        }
      }
      for (status = 0; status < p->nLiterals; status = status + 1) {
        *(int *)((long)Lits + (long)status * 4) = iVar1 + *(int *)((long)Lits + (long)status * 4);
      }
      for (status = 0; status < p->nClauses; status = status + 1) {
        iVar2 = sat_solver2_addclause
                          ((sat_solver2 *)p_local,p->pClauses[status],p->pClauses[status + 1],0);
        if (iVar2 == 0) {
          sat_solver2_delete((sat_solver2 *)p_local);
          return (void *)0x0;
        }
      }
    }
    for (status = 0; status < p->nLiterals; status = status + 1) {
      *(int *)((long)Lits + (long)status * 4) =
           *(int *)((long)Lits + (long)status * 4) - (local_30 + -1) * iVar1;
    }
  }
  if (fInit != 0) {
    iVar1 = Aig_ManCiNum(p->pMan);
    iVar2 = Aig_ManRegNum(p->pMan);
    for (status = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pMan->vCis), status < iVar1;
        status = status + 1) {
      pvStack_68 = Vec_PtrEntry(p->pMan->vCis,status);
      local_6c = toLitCond(p->pVarNums[*(int *)((long)pvStack_68 + 0x24)],1);
      iVar1 = sat_solver2_addclause
                        ((sat_solver2 *)p_local,&local_6c,(lit *)&stack0xffffffffffffff98,0);
      if (iVar1 == 0) {
        sat_solver2_delete((sat_solver2 *)p_local);
        return (void *)0x0;
      }
    }
  }
  iVar1 = sat_solver2_simplify((sat_solver2 *)p_local);
  if (iVar1 == 0) {
    sat_solver2_delete((sat_solver2 *)p_local);
    p_local = (Cnf_Dat_t *)0x0;
  }
  return p_local;
}

Assistant:

void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit )
{
    sat_solver2 * pSat;
    int i, f, status;
    assert( nFrames > 0 );
    pSat = sat_solver2_new();
    sat_solver2_setnvars( pSat, p->nVars * nFrames );
    for ( i = 0; i < p->nClauses; i++ )
    {
        if ( !sat_solver2_addclause( pSat, p->pClauses[i], p->pClauses[i+1], 0 ) )
        {
            sat_solver2_delete( pSat );
            return NULL;
        }
    }
    if ( nFrames > 1 )
    {
        Aig_Obj_t * pObjLo, * pObjLi;
        int nLitsAll, * pLits, Lits[2];
        nLitsAll = 2 * p->nVars;
        pLits = p->pClauses[0];
        for ( f = 1; f < nFrames; f++ )
        {
            // add equality of register inputs/outputs for different timeframes
            Aig_ManForEachLiLoSeq( p->pMan, pObjLi, pObjLo, i )
            {
                Lits[0] = (f-1)*nLitsAll + toLitCond( p->pVarNums[pObjLi->Id], 0 );
                Lits[1] =  f   *nLitsAll + toLitCond( p->pVarNums[pObjLo->Id], 1 );
                if ( !sat_solver2_addclause( pSat, Lits, Lits + 2, 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
                Lits[0]++;
                Lits[1]--;
                if ( !sat_solver2_addclause( pSat, Lits, Lits + 2, 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
            }
            // add clauses for the next timeframe
            for ( i = 0; i < p->nLiterals; i++ )
                pLits[i] += nLitsAll;
            for ( i = 0; i < p->nClauses; i++ )
            {
                if ( !sat_solver2_addclause( pSat, p->pClauses[i], p->pClauses[i+1], 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
            }
        }
        // return literals to their original state
        nLitsAll = (f-1) * nLitsAll;
        for ( i = 0; i < p->nLiterals; i++ )
            pLits[i] -= nLitsAll;
    }
    if ( fInit )
    {
        Aig_Obj_t * pObjLo;
        int Lits[1];
        Aig_ManForEachLoSeq( p->pMan, pObjLo, i )
        {
            Lits[0] = toLitCond( p->pVarNums[pObjLo->Id], 1 );
            if ( !sat_solver2_addclause( pSat, Lits, Lits + 1, 0 ) )
            {
                sat_solver2_delete( pSat );
                return NULL;
            }
        }
    }
    status = sat_solver2_simplify(pSat);
    if ( status == 0 )
    {
        sat_solver2_delete( pSat );
        return NULL;
    }
    return pSat;
}